

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O3

bool __thiscall Datetime::parse_named(Datetime *this,Pig *pig)

{
  bool bVar1;
  size_type previous;
  bool bVar2;
  string token;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  previous = Pig::cursor(pig);
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  do {
    bVar1 = Pig::getUntilWS(pig,&local_68);
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_48,&local_68);
    bVar1 = Pig::skipWS(pig);
  } while (bVar1);
  Pig::restoreTo(pig,previous);
  bVar1 = initializeNow(this,pig);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = initializeYesterday(this,pig);
    if (!bVar1) {
      bVar1 = initializeToday(this,pig);
      if (!bVar1) {
        bVar1 = initializeTomorrow(this,pig);
        if (!bVar1) {
          bVar1 = initializeOrdinal(this,pig);
          if (!bVar1) {
            bVar1 = initializeDayName(this,pig);
            if (!bVar1) {
              bVar1 = initializeMonthName(this,pig);
              if (!bVar1) {
                bVar1 = initializeLater(this,pig);
                if (!bVar1) {
                  bVar1 = initializeSopd(this,pig);
                  if (!bVar1) {
                    bVar1 = initializeSod(this,pig);
                    if (!bVar1) {
                      bVar1 = initializeSond(this,pig);
                      if (!bVar1) {
                        bVar1 = initializeEopd(this,pig);
                        if (!bVar1) {
                          bVar1 = initializeEod(this,pig);
                          if (!bVar1) {
                            bVar1 = initializeEond(this,pig);
                            if (!bVar1) {
                              bVar1 = initializeSopw(this,pig);
                              if (!bVar1) {
                                bVar1 = initializeSow(this,pig);
                                if (!bVar1) {
                                  bVar1 = initializeSonw(this,pig);
                                  if (!bVar1) {
                                    bVar1 = initializeEopw(this,pig);
                                    if (!bVar1) {
                                      bVar1 = initializeEow(this,pig);
                                      if (!bVar1) {
                                        bVar1 = initializeEonw(this,pig);
                                        if (!bVar1) {
                                          bVar1 = initializeSopww(this,pig);
                                          if (!bVar1) {
                                            bVar1 = initializeSonww(this,pig);
                                            if (!bVar1) {
                                              bVar1 = initializeSoww(this,pig);
                                              if (!bVar1) {
                                                bVar1 = initializeEopww(this,pig);
                                                if (!bVar1) {
                                                  bVar1 = initializeEonww(this,pig);
                                                  if (!bVar1) {
                                                    bVar1 = initializeEoww(this,pig);
                                                    if (!bVar1) {
                                                      bVar1 = initializeSopm(this,pig);
                                                      if (!bVar1) {
                                                        bVar1 = initializeSom(this,pig);
                                                        if (!bVar1) {
                                                          bVar1 = initializeSonm(this,pig);
                                                          if (!bVar1) {
                                                            bVar1 = initializeEopm(this,pig);
                                                            if (!bVar1) {
                                                              bVar1 = initializeEom(this,pig);
                                                              if (!bVar1) {
                                                                bVar1 = initializeEonm(this,pig);
                                                                if (!bVar1) {
                                                                  bVar1 = initializeSopq(this,pig);
                                                                  if (!bVar1) {
                                                                    bVar1 = initializeSoq(this,pig);
                                                                    if (!bVar1) {
                                                                      bVar1 = initializeSonq(this,
                                                  pig);
                                                  if (!bVar1) {
                                                    bVar1 = initializeEopq(this,pig);
                                                    if (!bVar1) {
                                                      bVar1 = initializeEoq(this,pig);
                                                      if (!bVar1) {
                                                        bVar1 = initializeEonq(this,pig);
                                                        if (!bVar1) {
                                                          bVar1 = initializeSopy(this,pig);
                                                          if (!bVar1) {
                                                            bVar1 = initializeSoy(this,pig);
                                                            if (!bVar1) {
                                                              bVar1 = initializeSony(this,pig);
                                                              if (!bVar1) {
                                                                bVar1 = initializeEopy(this,pig);
                                                                if (!bVar1) {
                                                                  bVar1 = initializeEoy(this,pig);
                                                                  if (!bVar1) {
                                                                    bVar1 = initializeEony(this,pig)
                                                                    ;
                                                                    if (!bVar1) {
                                                                      bVar1 = initializeEaster(this,
                                                  pig);
                                                  if (!bVar1) {
                                                    bVar1 = initializeMidsommar(this,pig);
                                                    if (!bVar1) {
                                                      bVar1 = initializeMidsommarafton(this,pig);
                                                      if (!bVar1) {
                                                        bVar1 = initializeInformalTime(this,pig);
                                                        if (!bVar1) {
                                                          Pig::restoreTo(pig,previous);
                                                          bVar2 = false;
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool Datetime::parse_named (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  // Experimental handling of date phrases, such as "first monday in march".
  // Note that this requires that phrases are delimited by EOS or WS.
  std::string token;
  std::vector <std::string> tokens;
  while (pig.getUntilWS (token))
  {
    tokens.push_back (token);
    if (! pig.skipWS ())
      break;
  }

/*
  // This group contains "1st monday ..." which must be processed before
  // initializeOrdinal below.
  if (initializeNthDayInMonth (tokens))
  {
    return true;
  }
*/

  // Restoration necessary because of the tokenization.
  pig.restoreTo (checkpoint);

  if (initializeNow            (pig) ||
      initializeYesterday      (pig) ||
      initializeToday          (pig) ||
      initializeTomorrow       (pig) ||
      initializeOrdinal        (pig) ||
      initializeDayName        (pig) ||
      initializeMonthName      (pig) ||
      initializeLater          (pig) ||
      initializeSopd           (pig) ||
      initializeSod            (pig) ||
      initializeSond           (pig) ||
      initializeEopd           (pig) ||
      initializeEod            (pig) ||
      initializeEond           (pig) ||
      initializeSopw           (pig) ||
      initializeSow            (pig) ||
      initializeSonw           (pig) ||
      initializeEopw           (pig) ||
      initializeEow            (pig) ||
      initializeEonw           (pig) ||
      initializeSopww          (pig) ||  // Must appear after sopw
      initializeSonww          (pig) ||  // Must appear after sonw
      initializeSoww           (pig) ||  // Must appear after sow
      initializeEopww          (pig) ||  // Must appear after eopw
      initializeEonww          (pig) ||  // Must appear after eonw
      initializeEoww           (pig) ||  // Must appear after eow
      initializeSopm           (pig) ||
      initializeSom            (pig) ||
      initializeSonm           (pig) ||
      initializeEopm           (pig) ||
      initializeEom            (pig) ||
      initializeEonm           (pig) ||
      initializeSopq           (pig) ||
      initializeSoq            (pig) ||
      initializeSonq           (pig) ||
      initializeEopq           (pig) ||
      initializeEoq            (pig) ||
      initializeEonq           (pig) ||
      initializeSopy           (pig) ||
      initializeSoy            (pig) ||
      initializeSony           (pig) ||
      initializeEopy           (pig) ||
      initializeEoy            (pig) ||
      initializeEony           (pig) ||
      initializeEaster         (pig) ||
      initializeMidsommar      (pig) ||
      initializeMidsommarafton (pig) ||
      initializeInformalTime   (pig))
  {
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}